

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JupiterAce.cpp
# Opt level: O0

bool IsValidDeepThoughtData(Data *data)

{
  int iVar1;
  const_reference pvVar2;
  int local_24;
  value_type local_1d;
  int i;
  uint8_t sum;
  int offset;
  Data *data_local;
  
  local_24 = GetDeepThoughtDataOffset(data);
  if ((local_24 != 0) && (iVar1 = Data::size(data), local_24 != iVar1)) {
    local_1d = '\0';
    for (; iVar1 = Data::size(data), local_24 < iVar1 + -1; local_24 = local_24 + 1) {
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                          (long)local_24);
      local_1d = local_1d + *pvVar2;
    }
    iVar1 = Data::size(data);
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                        (long)(iVar1 + -1));
    return local_1d == *pvVar2;
  }
  return false;
}

Assistant:

bool IsValidDeepThoughtData(const Data& data)
{
    auto offset = GetDeepThoughtDataOffset(data);
    if (!offset || offset == data.size())
        return false;

    uint8_t sum = 0;
    for (auto i = offset; i < data.size() - 1; ++i)
        sum += data[i];

    return sum == data[data.size() - 1];
}